

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  uint uVar1;
  uint matchLength_00;
  ZSTD_compressedBlockState_t *pZVar2;
  BYTE *pBVar3;
  uint uVar4;
  uint uVar5;
  size_t code;
  long lVar6;
  ulong uVar7;
  BYTE *dst;
  seqStore_t *psVar8;
  bool bVar9;
  U32 lastSeqIdx;
  U32 *rep;
  size_t err_code;
  U32 ll0;
  U32 offBase;
  U32 matchLength;
  U32 litLength;
  U32 dictSize;
  repcodes_t updatedRepcodes;
  BYTE *iend;
  BYTE *ip;
  U32 startIdx;
  U32 idx;
  size_t blockSize_local;
  void *src_local;
  size_t inSeqsSize_local;
  ZSTD_Sequence *inSeqs_local;
  ZSTD_sequencePosition *seqPos_local;
  ZSTD_CCtx *cctx_local;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  uVar1 = seqPos->idx;
  updatedRepcodes.rep._4_8_ = (long)src + blockSize;
  if (cctx->cdict == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      matchLength = 0;
    }
    else {
      matchLength = (U32)(cctx->prefixDict).dictSize;
    }
  }
  else {
    matchLength = (U32)cctx->cdict->dictContentSize;
  }
  pZVar2 = (cctx->blockState).prevCBlock;
  _litLength = *(undefined8 *)pZVar2->rep;
  updatedRepcodes.rep[0] = pZVar2->rep[2];
  iend = (BYTE *)src;
  ip._4_4_ = uVar1;
  while( true ) {
    bVar9 = false;
    if ((ip._4_4_ < inSeqsSize) && (bVar9 = true, inSeqs[ip._4_4_].matchLength == 0)) {
      bVar9 = inSeqs[ip._4_4_].offset != 0;
    }
    if (!bVar9) {
      if (externalRepSearch == ZSTD_ps_auto) {
        __assert_fail("externalRepSearch != ZSTD_ps_auto",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x192b,
                      "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                     );
      }
      if (uVar1 <= ip._4_4_) {
        if ((externalRepSearch == ZSTD_ps_disable) && (ip._4_4_ != uVar1)) {
          uVar5 = ip._4_4_ - 1;
          if (uVar5 < uVar1 + 2) {
            if (uVar5 == uVar1 + 1) {
              updatedRepcodes.rep[0] = litLength;
              dictSize = inSeqs[ip._4_4_ - 2].offset;
              litLength = inSeqs[uVar5].offset;
            }
            else {
              if (uVar5 != uVar1) {
                __assert_fail("lastSeqIdx == startIdx",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                              ,0x193a,
                              "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                             );
              }
              updatedRepcodes.rep[0] = dictSize;
              dictSize = litLength;
              litLength = inSeqs[uVar5].offset;
            }
          }
          else {
            updatedRepcodes.rep[0] = inSeqs[ip._4_4_ - 3].offset;
            dictSize = inSeqs[ip._4_4_ - 2].offset;
            litLength = inSeqs[uVar5].offset;
          }
        }
        pZVar2 = (cctx->blockState).nextCBlock;
        *(undefined8 *)pZVar2->rep = _litLength;
        pZVar2->rep[2] = updatedRepcodes.rep[0];
        if (inSeqs[ip._4_4_].litLength != 0) {
          ZSTD_storeLastLiterals(&cctx->seqStore,iend,(ulong)inSeqs[ip._4_4_].litLength);
          iend = iend + inSeqs[ip._4_4_].litLength;
          seqPos->posInSrc = (ulong)inSeqs[ip._4_4_].litLength + seqPos->posInSrc;
        }
        if (iend == (BYTE *)updatedRepcodes.rep._4_8_) {
          seqPos->idx = ip._4_4_ + 1;
          cctx_local = (ZSTD_CCtx *)0x0;
        }
        else {
          cctx_local = (ZSTD_CCtx *)0xffffffffffffff95;
        }
        return (size_t)cctx_local;
      }
      __assert_fail("idx >= startIdx",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x192c,
                    "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                   );
    }
    uVar5 = inSeqs[ip._4_4_].litLength;
    matchLength_00 = inSeqs[ip._4_4_].matchLength;
    if (externalRepSearch == ZSTD_ps_disable) {
      if (inSeqs[ip._4_4_].offset == 0) {
        __assert_fail("(inSeqs[idx].offset)>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x1916,
                      "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                     );
      }
      err_code._4_4_ = inSeqs[ip._4_4_].offset + 3;
    }
    else {
      err_code._4_4_ = ZSTD_finalizeOffBase(inSeqs[ip._4_4_].offset,&litLength,(uint)(uVar5 == 0));
      ZSTD_updateRep(&litLength,err_code._4_4_,(uint)(uVar5 == 0));
    }
    if ((cctx->appliedParams).validateSequences != 0) {
      seqPos->posInSrc = (ulong)(uVar5 + matchLength_00) + seqPos->posInSrc;
      code = ZSTD_validateSequence
                       (err_code._4_4_,matchLength_00,(cctx->appliedParams).cParams.minMatch,
                        seqPos->posInSrc,(cctx->appliedParams).cParams.windowLog,(ulong)matchLength,
                        (cctx->appliedParams).useSequenceProducer);
      uVar4 = ERR_isError(code);
      if (uVar4 != 0) {
        return code;
      }
    }
    if ((cctx->seqStore).maxNbSeq <= (ulong)(ip._4_4_ - seqPos->idx)) {
      return 0xffffffffffffff95;
    }
    psVar8 = &cctx->seqStore;
    uVar7 = (ulong)uVar5;
    if ((cctx->seqStore).maxNbSeq <=
        (ulong)((long)(cctx->seqStore).sequences - (long)psVar8->sequencesStart >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < (cctx->seqStore).maxNbLit) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if ((cctx->seqStore).litStart + (cctx->seqStore).maxNbLit < (cctx->seqStore).lit + uVar7) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if ((ulong)updatedRepcodes.rep._4_8_ < iend + uVar7) break;
    if ((BYTE *)(updatedRepcodes.rep._4_8_ + -0x20) < iend + uVar7) {
      ZSTD_safecopyLiterals
                ((cctx->seqStore).lit,iend,iend + uVar7,(BYTE *)(updatedRepcodes.rep._4_8_ + -0x20))
      ;
    }
    else {
      ZSTD_copy16((cctx->seqStore).lit,iend);
      if (0x10 < uVar7) {
        pBVar3 = (cctx->seqStore).lit;
        dst = pBVar3 + 0x10;
        lVar6 = (long)dst - (long)(iend + 0x10);
        if ((lVar6 < 0x10) && (-0x10 < lVar6)) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        ZSTD_copy16(dst,iend + 0x10);
        if (0x10 < (long)(uVar7 - 0x10)) {
          oend = pBVar3 + 0x20;
          pBVar3 = iend;
          do {
            op = pBVar3 + 0x20;
            ZSTD_copy16(oend,op);
            ZSTD_copy16(oend + 0x10,pBVar3 + 0x30);
            oend = oend + 0x20;
            pBVar3 = op;
          } while (oend < dst + (uVar7 - 0x10));
        }
      }
    }
    (cctx->seqStore).lit = (cctx->seqStore).lit + uVar7;
    if (0xffff < uVar7) {
      if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2b2,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
      (cctx->seqStore).longLengthPos =
           (U32)((long)(cctx->seqStore).sequences - (long)psVar8->sequencesStart >> 3);
    }
    ((cctx->seqStore).sequences)->litLength = (U16)uVar5;
    ((cctx->seqStore).sequences)->offBase = err_code._4_4_;
    if ((ulong)matchLength_00 < 3) {
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar7 = (ulong)matchLength_00 - 3;
    if (0xffff < uVar7) {
      if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((long)(cctx->seqStore).sequences - (long)psVar8->sequencesStart >> 3);
    }
    ((cctx->seqStore).sequences)->mlBase = (U16)uVar7;
    (cctx->seqStore).sequences = (cctx->seqStore).sequences + 1;
    iend = iend + (matchLength_00 + uVar5);
    ip._4_4_ = ip._4_4_ + 1;
  }
  __assert_fail("literals + litLength <= litLimit",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                ,0x2a1,
                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)")
  ;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx* cctx,
                                              ZSTD_sequencePosition* seqPos,
                                        const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                        const void* src, size_t blockSize,
                                        ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 const startIdx = idx;
    BYTE const* ip = (BYTE const*)(src);
    const BYTE* const iend = ip + blockSize;
    repcodes_t updatedRepcodes;
    U32 dictSize;

    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreExplicitBlockDelim (blockSize = %zu)", blockSize);

    if (cctx->cdict) {
        dictSize = (U32)cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = (U32)cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (; idx < inSeqsSize && (inSeqs[idx].matchLength != 0 || inSeqs[idx].offset != 0); ++idx) {
        U32 const litLength = inSeqs[idx].litLength;
        U32 const matchLength = inSeqs[idx].matchLength;
        U32 offBase;

        if (externalRepSearch == ZSTD_ps_disable) {
            offBase = OFFSET_TO_OFFBASE(inSeqs[idx].offset);
        } else {
            U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(inSeqs[idx].offset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                cctx->appliedParams.cParams.windowLog, dictSize, cctx->appliedParams.useSequenceProducer),
                                                "Sequence validation failed");
        }
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
    }

    /* If we skipped repcode search while parsing, we need to update repcodes now */
    assert(externalRepSearch != ZSTD_ps_auto);
    assert(idx >= startIdx);
    if (externalRepSearch == ZSTD_ps_disable && idx != startIdx) {
        U32* const rep = updatedRepcodes.rep;
        U32 lastSeqIdx = idx - 1; /* index of last non-block-delimiter sequence */

        if (lastSeqIdx >= startIdx + 2) {
            rep[2] = inSeqs[lastSeqIdx - 2].offset;
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else if (lastSeqIdx == startIdx + 1) {
            rep[2] = rep[0];
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else {
            assert(lastSeqIdx == startIdx);
            rep[2] = rep[1];
            rep[1] = rep[0];
            rep[0] = inSeqs[lastSeqIdx].offset;
        }
    }

    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    if (inSeqs[idx].litLength) {
        DEBUGLOG(6, "Storing last literals of size: %u", inSeqs[idx].litLength);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, inSeqs[idx].litLength);
        ip += inSeqs[idx].litLength;
        seqPos->posInSrc += inSeqs[idx].litLength;
    }
    RETURN_ERROR_IF(ip != iend, externalSequences_invalid, "Blocksize doesn't agree with block delimiter!");
    seqPos->idx = idx+1;
    return 0;
}